

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

uint8_t * __thiscall google::protobuf::io::EpsCopyOutputStream::Next(EpsCopyOutputStream *this)

{
  uint8_t *puVar1;
  undefined8 uVar2;
  int iVar3;
  ulong uVar4;
  uint8_t *puVar5;
  char *failure_msg;
  int size;
  void *data;
  uint local_34;
  LogMessageFatal local_30;
  
  if (this->had_error_ == true) {
    failure_msg = "!had_error_";
    iVar3 = 0x34d;
LAB_0024f336:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
               ,iVar3,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_30);
  }
  if (this->stream_ == (ZeroCopyOutputStream *)0x0) {
    this->had_error_ = true;
  }
  else {
    puVar1 = this->end_;
    puVar5 = this->buffer_;
    if (this->buffer_end_ != (uint8_t *)0x0) {
      memcpy(this->buffer_end_,puVar5,(long)puVar1 - (long)puVar5);
      do {
        iVar3 = (*this->stream_->_vptr_ZeroCopyOutputStream[2])(this->stream_,&local_30,&local_34);
        if ((char)iVar3 == '\0') {
          this->had_error_ = true;
          goto LAB_0024f2ff;
        }
        uVar4 = (ulong)local_34;
      } while (uVar4 == 0);
      if (0x10 < (int)local_34) {
        uVar2 = *(undefined8 *)(this->end_ + 8);
        *(undefined8 *)local_30.super_LogMessage._0_8_ = *(undefined8 *)this->end_;
        *(undefined8 *)(local_30.super_LogMessage._0_8_ + 8) = uVar2;
        this->end_ = (uint8_t *)(local_30.super_LogMessage._0_8_ + (uVar4 - 0x10));
        this->buffer_end_ = (uint8_t *)0x0;
        return (uint8_t *)local_30.super_LogMessage._0_8_;
      }
      if ((int)local_34 < 1) {
        failure_msg = "size > 0";
        iVar3 = 0x363;
        goto LAB_0024f336;
      }
      uVar2 = *(undefined8 *)(this->end_ + 8);
      *(undefined8 *)puVar5 = *(undefined8 *)this->end_;
      *(undefined8 *)(this->buffer_ + 8) = uVar2;
      this->buffer_end_ = (uint8_t *)local_30.super_LogMessage._0_8_;
      puVar5 = puVar5 + uVar4;
      goto LAB_0024f303;
    }
    uVar2 = *(undefined8 *)(puVar1 + 8);
    *(undefined8 *)puVar5 = *(undefined8 *)puVar1;
    *(undefined8 *)(this->buffer_ + 8) = uVar2;
    this->buffer_end_ = puVar1;
  }
LAB_0024f2ff:
  puVar5 = this->buffer_ + 0x10;
LAB_0024f303:
  this->end_ = puVar5;
  return this->buffer_;
}

Assistant:

uint8_t* EpsCopyOutputStream::Next() {
  ABSL_DCHECK(!had_error_);  // NOLINT
  if (ABSL_PREDICT_FALSE(stream_ == nullptr)) return Error();
  if (buffer_end_) {
    // We're in the patch buffer and need to fill up the previous buffer.
    std::memcpy(buffer_end_, buffer_, end_ - buffer_);
    uint8_t* ptr;
    int size;
    do {
      void* data;
      if (ABSL_PREDICT_FALSE(!stream_->Next(&data, &size))) {
        // Stream has an error, we use the patch buffer to continue to be
        // able to write.
        return Error();
      }
      ptr = static_cast<uint8_t*>(data);
    } while (size == 0);
    if (ABSL_PREDICT_TRUE(size > kSlopBytes)) {
      std::memcpy(ptr, end_, kSlopBytes);
      end_ = ptr + size - kSlopBytes;
      buffer_end_ = nullptr;
      return ptr;
    } else {
      ABSL_DCHECK(size > 0);  // NOLINT
      // Buffer to small
      std::memmove(buffer_, end_, kSlopBytes);
      buffer_end_ = ptr;
      end_ = buffer_ + size;
      return buffer_;
    }
  } else {
    std::memcpy(buffer_, end_, kSlopBytes);
    buffer_end_ = end_;
    end_ = buffer_ + kSlopBytes;
    return buffer_;
  }
}